

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_sig_serialize
              (uchar *adaptor_sig162,secp256k1_ge *r,secp256k1_ge *rp,secp256k1_scalar *sp,
              secp256k1_scalar *dleq_proof_e,secp256k1_scalar *dleq_proof_s)

{
  int iVar1;
  size_t local_48;
  size_t size;
  secp256k1_scalar *dleq_proof_s_local;
  secp256k1_scalar *dleq_proof_e_local;
  secp256k1_scalar *sp_local;
  secp256k1_ge *rp_local;
  secp256k1_ge *r_local;
  uchar *adaptor_sig162_local;
  
  local_48 = 0x21;
  size = (size_t)dleq_proof_s;
  dleq_proof_s_local = dleq_proof_e;
  dleq_proof_e_local = sp;
  sp_local = (secp256k1_scalar *)rp;
  rp_local = r;
  r_local = (secp256k1_ge *)adaptor_sig162;
  iVar1 = secp256k1_eckey_pubkey_serialize(r,adaptor_sig162,&local_48,1);
  if (iVar1 == 0) {
    adaptor_sig162_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_eckey_pubkey_serialize
                      ((secp256k1_ge *)sp_local,(uchar *)((long)(r_local->x).n + 0x21),&local_48,1);
    if (iVar1 == 0) {
      adaptor_sig162_local._4_4_ = 0;
    }
    else {
      secp256k1_scalar_get_b32((uchar *)((long)(r_local->y).n + 0x1a),dleq_proof_e_local);
      secp256k1_scalar_get_b32((uchar *)((long)r_local[1].x.n + 10),dleq_proof_s_local);
      secp256k1_scalar_get_b32((uchar *)((long)r_local[1].y.n + 2),(secp256k1_scalar *)size);
      adaptor_sig162_local._4_4_ = 1;
    }
  }
  return adaptor_sig162_local._4_4_;
}

Assistant:

static int secp256k1_ecdsa_adaptor_sig_serialize(unsigned char *adaptor_sig162, secp256k1_ge *r, secp256k1_ge *rp, const secp256k1_scalar *sp, const secp256k1_scalar *dleq_proof_e, const secp256k1_scalar *dleq_proof_s) {
    size_t size = 33;

    if (!secp256k1_eckey_pubkey_serialize(r, adaptor_sig162, &size, 1)) {
        return 0;
    }
    if (!secp256k1_eckey_pubkey_serialize(rp, &adaptor_sig162[33], &size, 1)) {
        return 0;
    }
    secp256k1_scalar_get_b32(&adaptor_sig162[66], sp);
    secp256k1_scalar_get_b32(&adaptor_sig162[98], dleq_proof_e);
    secp256k1_scalar_get_b32(&adaptor_sig162[130], dleq_proof_s);

    return 1;
}